

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coder.cc
# Opt level: O0

void __thiscall Encoder::RemoveLast(Encoder *this,size_t N)

{
  size_t sVar1;
  ostream *poVar2;
  S2LogMessage local_30;
  S2LogMessageVoidify local_19;
  ulong local_18;
  size_t N_local;
  Encoder *this_local;
  
  local_18 = N;
  N_local = (size_t)this;
  sVar1 = length(this);
  if (local_18 <= sVar1) {
    this->buf_ = this->buf_ + -local_18;
    return;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.cc"
             ,0x4b,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_30);
  poVar2 = std::operator<<(poVar2,"Check failed: length() >= N ");
  S2LogMessageVoidify::operator&(&local_19,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

void Encoder::RemoveLast(size_t N) {
  S2_CHECK(length() >= N);
  buf_ -= N;
}